

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O3

absolute_lookup * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneLibC::BreakTime
          (absolute_lookup *__return_storage_ptr__,TimeZoneLibC *this,time_point<seconds> *tp)

{
  long lVar1;
  tm *ptVar2;
  char *pcVar3;
  int_least64_t iVar4;
  ulong uVar5;
  undefined4 uVar6;
  fields fVar7;
  time_t t;
  tm tm;
  duration local_60;
  tm local_58;
  
  (__return_storage_ptr__->cs).f_.m = '\x01';
  (__return_storage_ptr__->cs).f_.d = '\x01';
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->is_dst = false;
  __return_storage_ptr__->abbr = "-00";
  lVar1 = (tp->__d).__r;
  local_60.__r = lVar1;
  if (this->local_ == true) {
    ptVar2 = localtime_r(&local_60.__r,&local_58);
  }
  else {
    ptVar2 = gmtime_r(&local_60.__r,&local_58);
  }
  if (ptVar2 == (tm *)0x0) {
    if (lVar1 < 0) {
      uVar5 = 0x101;
      iVar4 = -0x8000000000000000;
    }
    else {
      fVar7 = detail::impl::n_sec(0x7fffffffffffffff,0xc,0x1f,0x17,0x3b,0x3b);
      iVar4 = fVar7.y;
      uVar5 = fVar7._8_8_ & 0xffffffffff;
    }
    (__return_storage_ptr__->cs).f_.y = iVar4;
    (__return_storage_ptr__->cs).f_.m = (char)uVar5;
    (__return_storage_ptr__->cs).f_.d = (char)(uVar5 >> 8);
    (__return_storage_ptr__->cs).f_.hh = (char)(uVar5 >> 0x10);
    (__return_storage_ptr__->cs).f_.mm = (char)(uVar5 >> 0x18);
    (__return_storage_ptr__->cs).f_.ss = (char)(uVar5 >> 0x20);
    *(int3 *)&(__return_storage_ptr__->cs).f_.field_0xd = (int3)(uVar5 >> 0x28);
  }
  else {
    fVar7 = detail::impl::n_sec((long)ptVar2->tm_year + 0x76c,(long)ptVar2->tm_mon + 1,
                                (long)ptVar2->tm_mday,(long)ptVar2->tm_hour,(long)ptVar2->tm_min,
                                (long)ptVar2->tm_sec);
    (__return_storage_ptr__->cs).f_.y = fVar7.y;
    uVar6 = fVar7._8_4_;
    (__return_storage_ptr__->cs).f_.m = (char)uVar6;
    (__return_storage_ptr__->cs).f_.d = (char)((uint)uVar6 >> 8);
    (__return_storage_ptr__->cs).f_.hh = (char)((uint)uVar6 >> 0x10);
    (__return_storage_ptr__->cs).f_.mm = (char)((uint)uVar6 >> 0x18);
    (__return_storage_ptr__->cs).f_.ss = fVar7.ss;
    __return_storage_ptr__->offset = (int)ptVar2->tm_gmtoff;
    if (this->local_ == true) {
      pcVar3 = ptVar2->tm_zone;
    }
    else {
      pcVar3 = "UTC";
    }
    __return_storage_ptr__->abbr = pcVar3;
    __return_storage_ptr__->is_dst = 0 < ptVar2->tm_isdst;
  }
  return __return_storage_ptr__;
}

Assistant:

time_zone::absolute_lookup TimeZoneLibC::BreakTime(
    const time_point<seconds>& tp) const {
  time_zone::absolute_lookup al;
  al.offset = 0;
  al.is_dst = false;
  al.abbr = "-00";

  const std::int_fast64_t s = ToUnixSeconds(tp);

  // If std::time_t cannot hold the input we saturate the output.
  if (s < std::numeric_limits<std::time_t>::min()) {
    al.cs = civil_second::min();
    return al;
  }
  if (s > std::numeric_limits<std::time_t>::max()) {
    al.cs = civil_second::max();
    return al;
  }

  const std::time_t t = static_cast<std::time_t>(s);
  std::tm tm;
  std::tm* tmp = local_ ? local_time(&t, &tm) : gm_time(&t, &tm);

  // If std::tm cannot hold the result we saturate the output.
  if (tmp == nullptr) {
    al.cs = (s < 0) ? civil_second::min() : civil_second::max();
    return al;
  }

  const year_t year = tmp->tm_year + year_t{1900};
  al.cs = civil_second(year, tmp->tm_mon + 1, tmp->tm_mday, tmp->tm_hour,
                       tmp->tm_min, tmp->tm_sec);
  al.offset = static_cast<int>(tm_gmtoff(*tmp));
  al.abbr = local_ ? tm_zone(*tmp) : "UTC";  // as expected by cctz
  al.is_dst = tmp->tm_isdst > 0;
  return al;
}